

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

uint256 * ComputeTaprootMerkleRoot
                    (uint256 *__return_storage_ptr__,Span<const_unsigned_char> control,
                    uint256 *tapleaf_hash)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  ulong uVar9;
  uchar *puVar10;
  long in_FS_OFFSET;
  Span<const_unsigned_char> a;
  Span<const_unsigned_char> b;
  uint256 local_48;
  long local_28;
  
  uVar9 = control.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar9 < 0x21) {
    __assert_fail("control.size() >= TAPROOT_CONTROL_BASE_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                  ,0x736,
                  "uint256 ComputeTaprootMerkleRoot(Span<const unsigned char>, const uint256 &)");
  }
  if (0x1021 < uVar9) {
    __assert_fail("control.size() <= TAPROOT_CONTROL_MAX_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                  ,0x737,
                  "uint256 ComputeTaprootMerkleRoot(Span<const unsigned char>, const uint256 &)");
  }
  if (((int)control.m_size - 1U & 0x1f) != 0) {
    __assert_fail("(control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                  ,0x738,
                  "uint256 ComputeTaprootMerkleRoot(Span<const unsigned char>, const uint256 &)");
  }
  uVar1 = *(undefined4 *)(tapleaf_hash->super_base_blob<256U>).m_data._M_elems;
  uVar2 = *(undefined4 *)((tapleaf_hash->super_base_blob<256U>).m_data._M_elems + 4);
  uVar3 = *(undefined4 *)((tapleaf_hash->super_base_blob<256U>).m_data._M_elems + 8);
  uVar4 = *(undefined4 *)((tapleaf_hash->super_base_blob<256U>).m_data._M_elems + 0xc);
  uVar5 = *(undefined4 *)((tapleaf_hash->super_base_blob<256U>).m_data._M_elems + 0x14);
  uVar6 = *(undefined4 *)((tapleaf_hash->super_base_blob<256U>).m_data._M_elems + 0x18);
  uVar7 = *(undefined4 *)((tapleaf_hash->super_base_blob<256U>).m_data._M_elems + 0x1c);
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
       *(undefined4 *)((tapleaf_hash->super_base_blob<256U>).m_data._M_elems + 0x10);
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x14) = uVar5;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar6;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x1c) = uVar7;
  *(undefined4 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = uVar1;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 4) = uVar2;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) = uVar3;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0xc) = uVar4;
  uVar8 = (uint)(uVar9 + 0x1fffffffdf >> 5);
  if (0 < (int)uVar8) {
    puVar10 = control.m_data + 0x21;
    uVar9 = (ulong)(uVar8 & 0x7fffffff);
    do {
      a.m_size = 0x20;
      a.m_data = (uchar *)__return_storage_ptr__;
      b.m_size = 0x20;
      b.m_data = puVar10;
      ComputeTapbranchHash(&local_48,a,b);
      *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
           local_48.super_base_blob<256U>.m_data._M_elems._16_4_;
      *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x14) =
           local_48.super_base_blob<256U>.m_data._M_elems._20_4_;
      *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) =
           local_48.super_base_blob<256U>.m_data._M_elems._24_4_;
      *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x1c) =
           local_48.super_base_blob<256U>.m_data._M_elems._28_4_;
      *(undefined4 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems =
           local_48.super_base_blob<256U>.m_data._M_elems._0_4_;
      *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 4) =
           local_48.super_base_blob<256U>.m_data._M_elems._4_4_;
      *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) =
           local_48.super_base_blob<256U>.m_data._M_elems._8_4_;
      *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0xc) =
           local_48.super_base_blob<256U>.m_data._M_elems._12_4_;
      puVar10 = puVar10 + 0x20;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 ComputeTaprootMerkleRoot(Span<const unsigned char> control, const uint256& tapleaf_hash)
{
    assert(control.size() >= TAPROOT_CONTROL_BASE_SIZE);
    assert(control.size() <= TAPROOT_CONTROL_MAX_SIZE);
    assert((control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE == 0);

    const int path_len = (control.size() - TAPROOT_CONTROL_BASE_SIZE) / TAPROOT_CONTROL_NODE_SIZE;
    uint256 k = tapleaf_hash;
    for (int i = 0; i < path_len; ++i) {
        Span node{Span{control}.subspan(TAPROOT_CONTROL_BASE_SIZE + TAPROOT_CONTROL_NODE_SIZE * i, TAPROOT_CONTROL_NODE_SIZE)};
        k = ComputeTapbranchHash(k, node);
    }
    return k;
}